

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t decode_number(archive_read *a,decode_table *table,uint8_t *p,uint16_t *num)

{
  int iVar1;
  rar5 *rar_00;
  wchar_t code;
  rar5 *rar;
  uint32_t pos;
  uint16_t bitfield;
  wchar_t ret;
  wchar_t dist;
  wchar_t bits;
  wchar_t i;
  uint16_t *num_local;
  uint8_t *p_local;
  decode_table *table_local;
  archive_read *a_local;
  
  _bits = num;
  num_local = (uint16_t *)p;
  p_local = (uint8_t *)table;
  table_local = (decode_table *)a;
  rar_00 = get_context(a);
  pos = read_bits_16((archive_read *)table_local,rar_00,(uint8_t *)num_local,
                     (uint16_t *)((long)&rar + 6));
  a_local._4_4_ = pos;
  if (pos == L'\0') {
    rar._6_2_ = rar._6_2_ & 0xfffe;
    if ((int)(uint)rar._6_2_ < *(int *)(p_local + (ulong)*(uint *)(p_local + 0x84) * 4 + 4)) {
      iVar1 = (int)(uint)rar._6_2_ >> (0x10U - (char)*(undefined4 *)(p_local + 0x84) & 0x1f);
      skip_bits(rar_00,(uint)p_local[(long)iVar1 + 0x88]);
      *_bits = *(uint16_t *)(p_local + (long)iVar1 * 2 + 0x488);
      a_local._4_4_ = L'\0';
    }
    else {
      ret = L'\x0f';
      dist = *(wchar_t *)(p_local + 0x84);
      do {
        dist = dist + L'\x01';
        if (L'\x0e' < dist) goto LAB_0016eb1d;
      } while (*(int *)(p_local + (long)dist * 4 + 4) <= (int)(uint)rar._6_2_);
      ret = dist;
LAB_0016eb1d:
      skip_bits(rar_00,ret);
      rar._0_4_ = *(int *)(p_local + (long)ret * 4 + 0x44) +
                  ((int)((uint)rar._6_2_ - *(int *)(p_local + (long)(ret + L'\xffffffff') * 4 + 4))
                  >> (0x10U - (char)ret & 0x1f));
      if (*(uint *)p_local <= (uint)rar) {
        rar._0_4_ = 0;
      }
      *_bits = *(uint16_t *)(p_local + (ulong)(uint)rar * 2 + 0xc88);
      a_local._4_4_ = L'\0';
    }
  }
  return a_local._4_4_;
}

Assistant:

static int decode_number(struct archive_read* a, struct decode_table* table,
    const uint8_t* p, uint16_t* num)
{
	int i, bits, dist, ret;
	uint16_t bitfield;
	uint32_t pos;
	struct rar5* rar = get_context(a);

	if(ARCHIVE_OK != (ret = read_bits_16(a, rar, p, &bitfield))) {
		return ret;
	}

	bitfield &= 0xfffe;

	if(bitfield < table->decode_len[table->quick_bits]) {
		int code = bitfield >> (16 - table->quick_bits);
		skip_bits(rar, table->quick_len[code]);
		*num = table->quick_num[code];
		return ARCHIVE_OK;
	}

	bits = 15;

	for(i = table->quick_bits + 1; i < 15; i++) {
		if(bitfield < table->decode_len[i]) {
			bits = i;
			break;
		}
	}

	skip_bits(rar, bits);

	dist = bitfield - table->decode_len[bits - 1];
	dist >>= (16 - bits);
	pos = table->decode_pos[bits] + dist;

	if(pos >= table->size)
		pos = 0;

	*num = table->decode_num[pos];
	return ARCHIVE_OK;
}